

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mandelbrot.c
# Opt level: O3

int color_from_gradient(gradient_t *gradient,float pos,pixel_color_t *color)

{
  gradient_color_t *left;
  ulong uVar1;
  gradient_color_t *right;
  ulong uVar2;
  bool bVar3;
  bool bVar4;
  
  uVar1 = (ulong)gradient->num_colors;
  if (1 < (long)uVar1) {
    bVar3 = false;
    uVar2 = 2;
    left = gradient->colors;
    do {
      right = left + 1;
      if ((left->pos <= pos) && (pos <= right->pos)) {
        color_from_gradient_range(left,right,pos,color);
        return -(uint)bVar3;
      }
      bVar3 = uVar1 <= uVar2;
      bVar4 = uVar2 != uVar1;
      uVar2 = uVar2 + 1;
      left = right;
    } while (bVar4);
  }
  return -1;
}

Assistant:

int color_from_gradient(const gradient_t *gradient, float pos, pixel_color_t *color)
{
    gradient_color_t *left = &gradient->colors[0];

    for (int i = 1; i < gradient->num_colors; ++i) {
        gradient_color_t *right = &gradient->colors[i];

        if (pos >= left->pos && pos <= right->pos) {
            color_from_gradient_range(left, right, pos, color);
            return 0;
        }

        left = right;
    }

    return -1;
}